

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O0

int __thiscall MatroskaDemuxer::ebml_read_sint(MatroskaDemuxer *this,uint32_t *id,int64_t *num)

{
  ulong uVar1;
  int iVar2;
  ostream *poVar3;
  VodCoreException *this_00;
  string local_1f0;
  ostringstream local_1c0 [8];
  ostringstream ss;
  offset_t pos;
  int64_t size;
  int local_30;
  int res;
  int negative;
  uint n;
  int64_t *num_local;
  uint32_t *id_local;
  MatroskaDemuxer *this_local;
  
  res = 1;
  local_30 = 0;
  _negative = (ulong *)num;
  num_local = (int64_t *)id;
  id_local = (uint32_t *)this;
  size._4_4_ = ebml_read_element_id(this,id,(int *)0x0);
  if ((size._4_4_ < 0) ||
     (size._4_4_ = ebml_read_element_length(this,(int64_t *)&pos), size._4_4_ < 0)) {
    this_local._4_4_ = size._4_4_;
  }
  else {
    if (((long)pos < 1) || (8 < (long)pos)) {
      uVar1 = (this->super_IOContextDemuxer).m_processedBytes;
      std::__cxx11::ostringstream::ostringstream(local_1c0);
      poVar3 = std::operator<<((ostream *)local_1c0,"Invalid sint element size ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,pos);
      poVar3 = std::operator<<(poVar3," at position ");
      std::ostream::operator<<(poVar3,uVar1);
      this_00 = (VodCoreException *)__cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      VodCoreException::VodCoreException(this_00,900,&local_1f0);
      __cxa_throw(this_00,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    iVar2 = IOContextDemuxer::get_byte(&this->super_IOContextDemuxer);
    *_negative = (long)iVar2;
    if (((long)iVar2 & 0x80U) != 0) {
      local_30 = 1;
      *_negative = *_negative & 0xffffffffffffff7f;
    }
    while ((long)(ulong)(uint)res < (long)pos) {
      uVar1 = *_negative;
      res = res + 1;
      iVar2 = IOContextDemuxer::get_byte(&this->super_IOContextDemuxer);
      *_negative = uVar1 << 8 | (long)iVar2;
    }
    if (local_30 != 0) {
      *_negative = *_negative - (1L << ((char)(pos << 3) - 1U & 0x3f));
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int MatroskaDemuxer::ebml_read_sint(uint32_t *id, int64_t *num)
{
    unsigned n = 1;
    int negative = 0, res;
    int64_t size;

    if ((res = ebml_read_element_id(id, nullptr)) < 0 || (res = ebml_read_element_length(&size)) < 0)
        return res;
    if (size < 1 || size > 8)
    {
        const offset_t pos = m_processedBytes;
        THROW(ERR_MATROSKA_PARSE, "Invalid sint element size " << size << " at position " << pos)
    }
    if ((*num = get_byte()) & 0x80)
    {
        negative = 1;
        *num &= ~0x80;
    }
    while (n++ < size) *num = *num << 8 | get_byte();

    /* make signed */
    if (negative)
        *num = *num - (1LL << (8 * size - 1));

    return 0;
}